

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::setCachingEnabled(QNetworkReplyImplPrivate *this,bool enable)

{
  byte bVar1;
  undefined8 uVar2;
  QAbstractNetworkCache *pQVar3;
  byte in_SIL;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffff98;
  int line;
  undefined7 in_stack_ffffffffffffffa8;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffffb8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  if (((bVar1 != 0) || (((ulong)in_RDI[0x12].context.category & 1) != 0)) &&
     ((bVar1 == 0 || (((ulong)in_RDI[0x12].context.category & 1) == 0)))) {
    line = (int)((ulong)in_RDI >> 0x20);
    if (bVar1 == 0) {
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)(CONCAT17(in_SIL,in_stack_ffffffffffffffa8) & 0x1ffffffffffffff),
                 line,(char *)in_stack_ffffffffffffff98);
      (*(code *)**(undefined8 **)in_RDI[0x11].context.function)();
      uVar2 = QMetaObject::className();
      QMessageLogger::debug
                (&stack0xffffffffffffffb8,
                 "QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false) -- backend %s probably needs to be fixed"
                 ,uVar2);
      pQVar3 = networkCache(in_stack_ffffffffffffff98);
      (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,in_RDI + 0xf);
      in_RDI[0x13].context.version = 0;
      in_RDI[0x13].context.line = 0;
      *(undefined1 *)&in_RDI[0x12].context.category = 0;
    }
    else if (in_RDI[0x15].context.function == (char *)0x0) {
      createCache(in_stack_ffffffffffffffb8);
    }
    else {
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)(CONCAT17(in_SIL,in_stack_ffffffffffffffa8) & 0x1ffffffffffffff),
                 line,(char *)in_stack_ffffffffffffff98);
      QMessageLogger::critical
                (local_28,
                 "QNetworkReplyImpl: backend error: caching was enabled after some bytes had been written"
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::setCachingEnabled(bool enable)
{
    if (!enable && !cacheEnabled)
        return;                 // nothing to do
    if (enable && cacheEnabled)
        return;                 // nothing to do either!

    if (enable) {
        if (Q_UNLIKELY(bytesDownloaded)) {
            // refuse to enable in this case
            qCritical("QNetworkReplyImpl: backend error: caching was enabled after some bytes had been written");
            return;
        }

        createCache();
    } else {
        // someone told us to turn on, then back off?
        // ok... but you should make up your mind
        qDebug("QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false) -- "
               "backend %s probably needs to be fixed",
               backend->metaObject()->className());
        networkCache()->remove(url);
        cacheSaveDevice = nullptr;
        cacheEnabled = false;
    }
}